

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int rbuVfsShmMap(sqlite3_file *pFile,int iRegion,int szRegion,int isWrite,void **pp)

{
  bool bVar1;
  int iVar2;
  sqlite3_io_methods *psVar3;
  long lVar4;
  void *__s;
  undefined4 in_register_0000000c;
  long lVar5;
  undefined4 in_register_00000034;
  int iVar6;
  
  if ((pFile[3].pMethods != (sqlite3_io_methods *)0x0) && ((pFile[3].pMethods)->iVersion - 1U < 2))
  {
    iVar2 = 0;
    bVar1 = true;
    lVar5 = (long)iRegion;
    if (iRegion <= *(int *)((long)&pFile[6].pMethods + 4)) {
      psVar3 = pFile[7].pMethods;
      iVar2 = sqlite3_initialize();
      iVar6 = (int)(lVar5 + 1);
      if (iVar2 == 0) {
        psVar3 = (sqlite3_io_methods *)sqlite3Realloc(psVar3,(long)iVar6 << 3);
      }
      else {
        psVar3 = (sqlite3_io_methods *)0x0;
      }
      iVar2 = 0;
      if (psVar3 == (sqlite3_io_methods *)0x0) {
        iVar2 = 7;
        bVar1 = false;
      }
      else {
        lVar4 = (long)*(int *)((long)&pFile[6].pMethods + 4);
        memset(&psVar3->iVersion + lVar4 * 2,0,((lVar5 + 1) - lVar4) * 8);
        pFile[7].pMethods = psVar3;
        *(int *)((long)&pFile[6].pMethods + 4) = iVar6;
        bVar1 = true;
      }
    }
    if ((bVar1) && (iVar2 = 0, *(long *)(&(pFile[7].pMethods)->iVersion + lVar5 * 2) == 0)) {
      iVar2 = sqlite3_initialize();
      if (iVar2 == 0) {
        __s = sqlite3Malloc((long)szRegion);
      }
      else {
        __s = (void *)0x0;
      }
      if (__s == (void *)0x0) {
        iVar2 = 7;
      }
      else {
        iVar2 = 0;
        memset(__s,0,(long)szRegion);
        *(void **)(&(pFile[7].pMethods)->iVersion + lVar5 * 2) = __s;
      }
    }
    if (iVar2 == 0) {
      *pp = *(void **)(&(pFile[7].pMethods)->iVersion + lVar5 * 2);
      iVar2 = 0;
    }
    else {
      *pp = (void *)0x0;
    }
    return iVar2;
  }
  iVar2 = (**(code **)(*(long *)pFile[1].pMethods + 0x68))
                    (pFile[1].pMethods,CONCAT44(in_register_00000034,iRegion),szRegion,
                     CONCAT44(in_register_0000000c,isWrite),pp);
  return iVar2;
}

Assistant:

static int rbuVfsShmMap(
  sqlite3_file *pFile, 
  int iRegion, 
  int szRegion, 
  int isWrite, 
  void volatile **pp
){
  rbu_file *p = (rbu_file*)pFile;
  int rc = SQLITE_OK;
  int eStage = (p->pRbu ? p->pRbu->eStage : 0);

  /* If not in RBU_STAGE_OAL, allow this call to pass through. Or, if this
  ** rbu is in the RBU_STAGE_OAL state, use heap memory for *-shm space 
  ** instead of a file on disk.  */
  assert( p->openFlags & (SQLITE_OPEN_MAIN_DB|SQLITE_OPEN_TEMP_DB) );
  if( eStage==RBU_STAGE_OAL || eStage==RBU_STAGE_MOVE ){
    if( iRegion<=p->nShm ){
      sqlite3_int64 nByte = (iRegion+1) * sizeof(char*);
      char **apNew = (char**)sqlite3_realloc64(p->apShm, nByte);
      if( apNew==0 ){
        rc = SQLITE_NOMEM;
      }else{
        memset(&apNew[p->nShm], 0, sizeof(char*) * (1 + iRegion - p->nShm));
        p->apShm = apNew;
        p->nShm = iRegion+1;
      }
    }

    if( rc==SQLITE_OK && p->apShm[iRegion]==0 ){
      char *pNew = (char*)sqlite3_malloc64(szRegion);
      if( pNew==0 ){
        rc = SQLITE_NOMEM;
      }else{
        memset(pNew, 0, szRegion);
        p->apShm[iRegion] = pNew;
      }
    }

    if( rc==SQLITE_OK ){
      *pp = p->apShm[iRegion];
    }else{
      *pp = 0;
    }
  }else{
    assert( p->apShm==0 );
    rc = p->pReal->pMethods->xShmMap(p->pReal, iRegion, szRegion, isWrite, pp);
  }

  return rc;
}